

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clone.cpp
# Opt level: O3

void __thiscall helics::apps::Clone::~Clone(Clone *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer piVar2;
  pointer pcVar3;
  Endpoint *pEVar4;
  CloningFilter *pCVar5;
  
  (this->super_App)._vptr_App = (_func_int **)&PTR__Clone_00546a78;
  if ((this->fileSaved == false) && ((this->super_App).outFileName._M_string_length != 0)) {
    saveFile(this,&(this->super_App).outFileName);
  }
  piVar2 = (this->pubPointCount).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->pubPointCount).super__Vector_base<int,_std::allocator<int>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  pcVar3 = (this->fedConfig)._M_dataplus._M_p;
  paVar1 = &(this->fedConfig).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->captureFederate)._M_dataplus._M_p;
  paVar1 = &(this->captureFederate).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  CLI::std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::~_Rb_tree(&(this->eptNames)._M_t);
  CLI::std::
  _Rb_tree<helics::InterfaceHandle,_std::pair<const_helics::InterfaceHandle,_int>,_std::_Select1st<std::pair<const_helics::InterfaceHandle,_int>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
  ::~_Rb_tree(&(this->eptids)._M_t);
  CLI::std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::~_Rb_tree(&(this->subkeys)._M_t);
  CLI::std::
  _Rb_tree<helics::InterfaceHandle,_std::pair<const_helics::InterfaceHandle,_int>,_std::_Select1st<std::pair<const_helics::InterfaceHandle,_int>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
  ::~_Rb_tree(&(this->subids)._M_t);
  std::
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  ::~vector((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
             *)&this->messages);
  pEVar4 = (this->cloneEndpoint)._M_t.
           super___uniq_ptr_impl<helics::Endpoint,_std::default_delete<helics::Endpoint>_>._M_t.
           super__Tuple_impl<0UL,_helics::Endpoint_*,_std::default_delete<helics::Endpoint>_>.
           super__Head_base<0UL,_helics::Endpoint_*,_false>._M_head_impl;
  if (pEVar4 != (Endpoint *)0x0) {
    (**(code **)((long)(pEVar4->super_Interface)._vptr_Interface + 8))();
  }
  (this->cloneEndpoint)._M_t.
  super___uniq_ptr_impl<helics::Endpoint,_std::default_delete<helics::Endpoint>_>._M_t.
  super__Tuple_impl<0UL,_helics::Endpoint_*,_std::default_delete<helics::Endpoint>_>.
  super__Head_base<0UL,_helics::Endpoint_*,_false>._M_head_impl = (Endpoint *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&this->cloneSubscriptionNames);
  CLI::std::deque<helics::Input,_std::allocator<helics::Input>_>::~deque(&this->subscriptions);
  CLI::std::
  vector<helics::apps::Clone::ValueCapture,_std::allocator<helics::apps::Clone::ValueCapture>_>::
  ~vector(&this->points);
  pCVar5 = (this->cFilt)._M_t.
           super___uniq_ptr_impl<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>
           .super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl;
  if (pCVar5 != (CloningFilter *)0x0) {
    (**(code **)(*(long *)&(pCVar5->super_Filter).super_Interface + 8))();
  }
  (this->cFilt)._M_t.
  super___uniq_ptr_impl<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>._M_t.
  super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>.
  super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl = (CloningFilter *)0x0;
  apps::App::~App(&this->super_App);
  return;
}

Assistant:

Clone::~Clone()
{
    try {
        if (!fileSaved && !outFileName.empty()) {
            saveFile(outFileName);
        }
    }
    catch (...) {
        // destructors should not throw
        ;
    }
}